

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

ActionResultHolder<BasicTestExpr<2>_> *
testing::internal::ActionResultHolder<BasicTestExpr<2>>::
PerformDefaultAction<BasicTestExpr<2>(bool)>
          (FunctionMockerBase<BasicTestExpr<2>_(bool)> *func_mocker,ArgumentTuple *args,
          string *call_description)

{
  ActionResultHolder<BasicTestExpr<2>_> *this;
  string *in_stack_00000008;
  ArgumentTuple *in_stack_00000010;
  FunctionMockerBase<BasicTestExpr<2>_(bool)> *in_stack_00000018;
  BasicTestExpr<2> in_stack_ffffffffffffffd4;
  
  this = (ActionResultHolder<BasicTestExpr<2>_> *)operator_new(0x10);
  FunctionMockerBase<BasicTestExpr<2>_(bool)>::PerformDefaultAction
            (in_stack_00000018,in_stack_00000010,in_stack_00000008);
  ActionResultHolder<BasicTestExpr<2>_>::ActionResultHolder(this,in_stack_ffffffffffffffd4);
  return this;
}

Assistant:

static ActionResultHolder* PerformDefaultAction(
      const FunctionMockerBase<F>* func_mocker,
      const typename Function<F>::ArgumentTuple& args,
      const string& call_description) {
    return new ActionResultHolder(
        func_mocker->PerformDefaultAction(args, call_description));
  }